

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityDamageStatusPdu.cpp
# Opt level: O3

void __thiscall
DIS::EntityDamageStatusPdu::marshal(EntityDamageStatusPdu *this,DataStream *dataStream)

{
  pointer pDVar1;
  ulong uVar2;
  long lVar3;
  DirectedEnergyDamage x;
  DirectedEnergyDamage local_90;
  
  WarfareFamilyPdu::marshal(&this->super_WarfareFamilyPdu,dataStream);
  EntityID::marshal(&this->_damagedEntityID,dataStream);
  DataStream::operator<<(dataStream,this->_padding1);
  DataStream::operator<<(dataStream,this->_padding2);
  DataStream::operator<<
            (dataStream,
             (short)((uint)(*(int *)&(this->_damageDescriptionRecords).
                                     super__Vector_base<DIS::DirectedEnergyDamage,_std::allocator<DIS::DirectedEnergyDamage>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                           *(int *)&(this->_damageDescriptionRecords).
                                    super__Vector_base<DIS::DirectedEnergyDamage,_std::allocator<DIS::DirectedEnergyDamage>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 5) * -0x5555);
  pDVar1 = (this->_damageDescriptionRecords).
           super__Vector_base<DIS::DirectedEnergyDamage,_std::allocator<DIS::DirectedEnergyDamage>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_damageDescriptionRecords).
      super__Vector_base<DIS::DirectedEnergyDamage,_std::allocator<DIS::DirectedEnergyDamage>_>.
      _M_impl.super__Vector_impl_data._M_finish != pDVar1) {
    lVar3 = 0x58;
    uVar2 = 0;
    do {
      local_90._vptr_DirectedEnergyDamage = (_func_int **)&PTR__DirectedEnergyDamage_001b4158;
      local_90._8_8_ = *(undefined8 *)((long)pDVar1 + lVar3 + -0x50);
      local_90._damageLocation._vptr_Vector3Float = (_func_int **)&PTR__Vector3Float_001b6790;
      local_90._damageLocation._z = *(float *)((long)pDVar1 + lVar3 + -0x38);
      local_90._damageLocation._8_8_ = *(undefined8 *)((long)pDVar1 + lVar3 + -0x40);
      local_90._48_4_ = *(undefined4 *)((long)pDVar1 + lVar3 + -0x28);
      local_90._40_8_ = *(undefined8 *)((long)pDVar1 + lVar3 + -0x30);
      local_90._fireEventID._vptr_EventIdentifier = (_func_int **)&PTR__EventIdentifier_001b4930;
      local_90._fireEventID._simulationAddress._vptr_SimulationAddress =
           (_func_int **)&PTR__SimulationAddress_001b5fb8;
      local_90._fireEventID._simulationAddress._8_4_ = *(undefined4 *)((long)pDVar1 + lVar3 + -0x10)
      ;
      local_90._fireEventID._eventNumber = *(unsigned_short *)((long)pDVar1 + lVar3 + -8);
      local_90._padding2 = *(unsigned_short *)((long)&pDVar1->_vptr_DirectedEnergyDamage + lVar3);
      DirectedEnergyDamage::marshal(&local_90,dataStream);
      DirectedEnergyDamage::~DirectedEnergyDamage(&local_90);
      uVar2 = uVar2 + 1;
      pDVar1 = (this->_damageDescriptionRecords).
               super__Vector_base<DIS::DirectedEnergyDamage,_std::allocator<DIS::DirectedEnergyDamage>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0x60;
    } while (uVar2 < (ulong)(((long)(this->_damageDescriptionRecords).
                                    super__Vector_base<DIS::DirectedEnergyDamage,_std::allocator<DIS::DirectedEnergyDamage>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar1 >> 5)
                            * -0x5555555555555555));
  }
  return;
}

Assistant:

void EntityDamageStatusPdu::marshal(DataStream& dataStream) const
{
    WarfareFamilyPdu::marshal(dataStream); // Marshal information in superclass first
    _damagedEntityID.marshal(dataStream);
    dataStream << _padding1;
    dataStream << _padding2;
    dataStream << ( unsigned short )_damageDescriptionRecords.size();

     for(size_t idx = 0; idx < _damageDescriptionRecords.size(); idx++)
     {
        DirectedEnergyDamage x = _damageDescriptionRecords[idx];
        x.marshal(dataStream);
     }

}